

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::set_default_package_name(char *str)

{
  Variable *pVVar1;
  
  pVVar1 = get_vars();
  std::__cxx11::string::assign((char *)&pVVar1->m_default_package_name);
  return;
}

Assistant:

static bool IsEnableFlag(int flag) { return (GetInstance().m_test_flags & flag) ? true : false; }